

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microfmt.hpp
# Opt level: O0

string * __thiscall
cpptrace::microfmt::format<char_const*const&,unsigned_long,unsigned_long_const&,char_const*const&>
          (string *__return_storage_ptr__,microfmt *this,char *fmt,char **args,unsigned_long *args_1
          ,unsigned_long *args_2,char **args_3)

{
  array<cpptrace::microfmt::detail::format_value,_4UL> args_00;
  char *fmt_end;
  microfmt *fmt_begin;
  anon_union_16_6_5e21074f_for_format_value_0 local_98;
  undefined8 local_88;
  anon_union_16_6_5e21074f_for_format_value_0 aStack_80;
  undefined8 uStack_70;
  anon_union_16_6_5e21074f_for_format_value_0 local_68;
  undefined8 local_58;
  anon_union_16_6_5e21074f_for_format_value_0 aStack_50;
  undefined8 uStack_40;
  unsigned_long *local_38;
  char **args_local_3;
  unsigned_long *args_local_2;
  unsigned_long *args_local_1;
  char **args_local;
  char *fmt_local;
  
  local_38 = args_2;
  args_local_3 = (char **)args_1;
  args_local_2 = (unsigned_long *)args;
  args_local_1 = (unsigned_long *)fmt;
  args_local = (char **)this;
  fmt_local = (char *)__return_storage_ptr__;
  fmt_end = (char *)strlen((char *)this);
  fmt_begin = this + (long)fmt_end;
  detail::format_value::format_value
            ((format_value *)&local_98.string_view_value,(char *)*args_local_1);
  detail::format_value::format_value((format_value *)&aStack_80.string_view_value,*args_local_2);
  detail::format_value::format_value
            ((format_value *)&local_68.string_view_value,(unsigned_long)*args_local_3);
  detail::format_value::format_value((format_value *)&aStack_50.string_view_value,(char *)*local_38)
  ;
  args_00._M_elems[0].field_0.string_view_value._M_str = local_98.string_view_value._M_str;
  args_00._M_elems[0].field_0.int64_value = local_98.int64_value;
  args_00._M_elems[0]._16_8_ = local_88;
  args_00._M_elems[1].field_0.int64_value = aStack_80.int64_value;
  args_00._M_elems[1].field_0.string_view_value._M_str = aStack_80.string_view_value._M_str;
  args_00._M_elems[1]._16_8_ = uStack_70;
  args_00._M_elems[2].field_0.int64_value = local_68.int64_value;
  args_00._M_elems[2].field_0.string_view_value._M_str = local_68.string_view_value._M_str;
  args_00._M_elems[2]._16_8_ = local_58;
  args_00._M_elems[3].field_0.int64_value = aStack_50.int64_value;
  args_00._M_elems[3].field_0.string_view_value._M_str = aStack_50.string_view_value._M_str;
  args_00._M_elems[3]._16_8_ = uStack_40;
  detail::format<4ul,char_const*>
            (__return_storage_ptr__,(detail *)this,(char *)fmt_begin,fmt_end,args_00);
  return __return_storage_ptr__;
}

Assistant:

std::string format(const char* fmt, Args&&... args) {
        return detail::format<sizeof...(args)>(fmt, fmt + std::strlen(fmt), {detail::format_value(args)...});
    }